

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalException.cpp
# Opt level: O3

void __thiscall
ApprovalTests::ApprovalMismatchException::ApprovalMismatchException
          (ApprovalMismatchException *this,string *received,string *approved)

{
  string local_38;
  
  *(undefined ***)&this->super_ApprovalException = &PTR__ApprovalException_0015d820;
  format(&local_38,(ApprovalMismatchException *)received,received,approved);
  ApprovalException::ApprovalException(&this->super_ApprovalException,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  *(undefined ***)&this->super_ApprovalException = &PTR__ApprovalException_0015d820;
  return;
}

Assistant:

ApprovalMismatchException::ApprovalMismatchException(const std::string& received,
                                                         const std::string& approved)
        : ApprovalException(format(received, approved))
    {
    }